

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

Result joypad_read(FileData *file_data,JoypadBuffer **out_buffer)

{
  ulong __size;
  ulong uVar1;
  bool bVar2;
  Result RVar3;
  JoypadBuffer *pJVar4;
  JoypadChunk *pJVar5;
  JoypadState *__dest;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  __size = file_data->size;
  if ((__size & 0xf) == 0) {
    uVar8 = __size >> 4;
    if (__size != 0) {
      lVar7 = 9;
      uVar9 = 0;
      uVar10 = 0;
      do {
        uVar1 = *(ulong *)(file_data->data + uVar9 * 0x10);
        if (uVar1 < uVar10) {
          joypad_read_cold_3();
LAB_001172dd:
          bVar2 = false;
        }
        else {
          lVar6 = -7;
          do {
            if (file_data->data[lVar6 + lVar7 + 7] != '\0') {
              joypad_read_cold_2();
              goto LAB_001172dd;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0);
          bVar2 = true;
          uVar10 = uVar1;
        }
        if (!bVar2) goto LAB_0011734f;
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar9 != uVar8);
    }
    pJVar4 = (JoypadBuffer *)calloc(1,0x48);
    pJVar5 = (JoypadChunk *)calloc(1,0x28);
    __dest = (JoypadState *)calloc(1,__size);
    pJVar5->data = __dest;
    pJVar5->capacity = uVar8;
    memcpy(__dest,file_data->data,file_data->size);
    pJVar5->size = uVar8;
    pJVar5->next = (JoypadChunk *)pJVar4;
    pJVar5->prev = (JoypadChunk *)pJVar4;
    (pJVar4->sentinel).next = pJVar5;
    (pJVar4->sentinel).prev = pJVar5;
    *out_buffer = pJVar4;
    RVar3 = OK;
  }
  else {
    joypad_read_cold_1();
LAB_0011734f:
    RVar3 = ERROR;
  }
  return RVar3;
}

Assistant:

Result joypad_read(const FileData* file_data, JoypadBuffer** out_buffer) {
  CHECK_MSG(file_data->size % sizeof(JoypadState) == 0,
            "Expected joypad file size to be multiple of %zu\n",
            sizeof(JoypadState));
  size_t size = file_data->size / sizeof(JoypadState);
  size_t i;
  Ticks last_ticks = 0;
  for (i = 0; i < size; ++i) {
    JoypadState* state = (JoypadState*)file_data->data + i;
    Ticks ticks = state->ticks;
    CHECK_MSG(ticks >= last_ticks,
              "Expected ticks to be sorted, got %" PRIu64 " then %" PRIu64 "\n",
              last_ticks, ticks);
    size_t j;
    for (j = 0; j < ARRAY_SIZE(state->padding); ++j) {
      CHECK_MSG(state->padding[j] == 0, "Expected padding to be zero, got %u\n",
                state->padding[i]);
    }
    last_ticks = ticks;
  }

  JoypadBuffer* buffer = xcalloc(1, sizeof(JoypadBuffer));
  JoypadChunk* new_chunk = alloc_joypad_chunk(size);
  memcpy(new_chunk->data, file_data->data, file_data->size);
  new_chunk->size = size;
  new_chunk->prev = new_chunk->next = &buffer->sentinel;
  buffer->sentinel.prev = buffer->sentinel.next = new_chunk;
  *out_buffer = buffer;
  return OK;
  ON_ERROR_RETURN;
}